

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this)

{
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  bound_handler;
  TextReader<fmt::Locale> bound_reader;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  reader;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_a0;
  TextReader<fmt::Locale> local_90;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  local_38;
  
  if ((this->flags_ & 1) == 0) {
    Read(this,(TextReader<fmt::Locale> *)0x0);
    return;
  }
  local_a0.handler_ = this->handler_;
  local_a0.super_NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>.
  super_NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
  ._vptr_NLHandler =
       (NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
        )&PTR__NLHandler_0018aad8;
  TextReader<fmt::Locale>::TextReader(&local_90,this->reader_);
  local_38.header_ = this->header_;
  local_38.flags_ = this->flags_;
  local_38.num_vars_and_exprs_ = 0;
  local_38.reader_ = &local_90;
  local_38.handler_ = &local_a0;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::Read(&local_38,(TextReader<fmt::Locale> *)0x0);
  Read(this,&local_90);
  TextReader<fmt::Locale>::~TextReader(&local_90);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}